

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseFieldList
          (WastParser *this,vector<wabt::Field,_std::allocator<wabt::Field>_> *fields)

{
  bool bVar1;
  Result result;
  bool local_61;
  undefined1 local_50 [8];
  Field field;
  vector<wabt::Field,_std::allocator<wabt::Field>_> *fields_local;
  WastParser *this_local;
  
  field._40_8_ = fields;
  do {
    bVar1 = PeekMatch(this,First_Type,0);
    local_61 = true;
    if (!bVar1) {
      local_61 = PeekMatch(this,Lpar,0);
    }
    if (local_61 == false) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    Field::Field((Field *)local_50);
    result = ParseField(this,(Field *)local_50);
    bVar1 = Failed(result);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::vector<wabt::Field,_std::allocator<wabt::Field>_>::push_back
                ((vector<wabt::Field,_std::allocator<wabt::Field>_> *)field._40_8_,
                 (value_type *)local_50);
    }
    Field::~Field((Field *)local_50);
  } while (!bVar1);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseFieldList(std::vector<Field>* fields) {
  WABT_TRACE(ParseFieldList);
  while (PeekMatch(TokenType::ValueType) || PeekMatch(TokenType::Lpar)) {
    Field field;
    CHECK_RESULT(ParseField(&field));
    fields->push_back(field);
  }
  return Result::Ok;
}